

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl_voxels.cpp
# Opt level: O2

uint __thiscall FVoxelModel::AddVertex(FVoxelModel *this,FModelVertex *vert,FVoxelMap *check)

{
  uint uVar1;
  Node *pNVar2;
  
  pNVar2 = TMap<FModelVertex,_unsigned_int,_FVoxelVertexHash,_FIndexInit>::GetNode(check,*vert);
  uVar1 = (pNVar2->Pair).Value;
  if (uVar1 == 0xffffffff) {
    uVar1 = TArray<FModelVertex,_FModelVertex>::Push(&this->mVertices,vert);
    pNVar2 = TMap<FModelVertex,_unsigned_int,_FVoxelVertexHash,_FIndexInit>::GetNode(check,*vert);
    (pNVar2->Pair).Value = uVar1;
  }
  return uVar1;
}

Assistant:

unsigned int FVoxelModel::AddVertex(FModelVertex &vert, FVoxelMap &check)
{
	unsigned int index = check[vert];
	if (index == 0xffffffff)
	{
		index = check[vert] =mVertices.Push(vert);
	}
	return index;
}